

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamHttp::Seek(BamHttp *this,int64_t *position,int origin)

{
  bool bVar1;
  int iVar2;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  iVar2 = (*(this->super_IBamIODevice)._vptr_IBamIODevice[10])();
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)&local_38,"BamHttp::Seek",&local_5a);
    std::__cxx11::string::string((string *)&local_58,"cannot seek on unopen connection",&local_59);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_38,&local_58);
  }
  else {
    DisconnectSocket(this);
    bVar1 = ConnectSocket(this);
    if (bVar1) {
      if (origin == 0) {
        this->m_filePosition = *position;
      }
      else {
        if (origin != 1) {
          std::__cxx11::string::string((string *)&local_38,"BamHttp::Seek",&local_5a);
          std::__cxx11::string::string((string *)&local_58,"unsupported seek origin",&local_59);
          IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_38,&local_58);
          goto LAB_001a2677;
        }
        this->m_filePosition = this->m_filePosition + *position;
      }
      return true;
    }
    std::__cxx11::string::string((string *)&local_38,"BamHttp::Seek",&local_5a);
    TcpSocket::GetErrorString_abi_cxx11_(&local_58,this->m_socket);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&local_38,&local_58);
  }
LAB_001a2677:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return false;
}

Assistant:

bool BamHttp::Seek(const int64_t& position, const int origin)
{

    // if HTTP device not in a valid state
    if (!IsOpen()) {
        SetErrorString("BamHttp::Seek", "cannot seek on unopen connection");
        return false;
    }

    // reset the connection
    DisconnectSocket();
    if (!ConnectSocket()) {
        SetErrorString("BamHttp::Seek", m_socket->GetErrorString());
        return false;
    }

    // udpate file position
    switch (origin) {
        case SEEK_CUR:
            m_filePosition += position;
            break;
        case SEEK_SET:
            m_filePosition = position;
            break;
        default:
            SetErrorString("BamHttp::Seek", "unsupported seek origin");
            return false;
    }

    // return success
    return true;
}